

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileInstaller::DefaultFilePermissions(cmFileInstaller *this)

{
  int iVar1;
  cmMakefile *this_00;
  bool bVar2;
  allocator local_31;
  string local_30;
  cmFileInstaller *local_10;
  cmFileInstaller *this_local;
  
  local_10 = this;
  cmFileCopier::DefaultFilePermissions(&this->super_cmFileCopier);
  iVar1 = *(int *)&(this->super_cmFileCopier).field_0xa4;
  if (iVar1 != 0) {
    if (iVar1 - 2U < 2) {
      this_00 = (this->super_cmFileCopier).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_30,"CMAKE_INSTALL_SO_NO_EXE",&local_31);
      bVar2 = cmMakefile::IsOn(this_00,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      if (bVar2) {
        return;
      }
    }
    else if (iVar1 != 5) {
      return;
    }
  }
  (this->super_cmFileCopier).FilePermissions =
       mode_owner_execute | (this->super_cmFileCopier).FilePermissions;
  (this->super_cmFileCopier).FilePermissions =
       mode_group_execute | (this->super_cmFileCopier).FilePermissions;
  (this->super_cmFileCopier).FilePermissions =
       mode_world_execute | (this->super_cmFileCopier).FilePermissions;
  return;
}

Assistant:

virtual void DefaultFilePermissions()
    {
    this->cmFileCopier::DefaultFilePermissions();
    // Add execute permissions based on the target type.
    switch(this->InstallType)
      {
      case cmInstallType_SHARED_LIBRARY:
      case cmInstallType_MODULE_LIBRARY:
        if(this->Makefile->IsOn("CMAKE_INSTALL_SO_NO_EXE"))
          {
          break;
          }
      case cmInstallType_EXECUTABLE:
      case cmInstallType_PROGRAMS:
        this->FilePermissions |= mode_owner_execute;
        this->FilePermissions |= mode_group_execute;
        this->FilePermissions |= mode_world_execute;
        break;
      default: break;
      }
    }